

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_PrintToTest_x_iutest_x_U32StringStringView_Test::Body
          (iu_PrintToTest_x_iutest_x_U32StringStringView_Test *this)

{
  size_t sVar1;
  Fixed *fixed;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> val;
  iuCodeMessage local_1d0;
  Fixed local_1a0;
  
  sVar1 = std::char_traits<char32_t>::length(L"Hello");
  memset(&local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1a0);
  val._M_str = L"Hello";
  val._M_len = sVar1;
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_1a0,val);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x41f,"Succeeded.\n");
  local_1d0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,fixed);
  std::__cxx11::string::~string((string *)&local_1d0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1a0);
  return;
}

Assistant:

IUTEST(SyntaxTest, EQ_RANGE)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 1, 2, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSERT_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_EXPECT_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_INFORM_EQ_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSUME_EQ_RANGE(a, b) << size;
}